

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O0

Vec_Int_t * Abc_NamComputeIdMap(Abc_Nam_t *p1,Abc_Nam_t *p2)

{
  int iVar1;
  char *pStr;
  int *piVar2;
  int local_40;
  int i;
  int iHandle1;
  int *piPlace;
  char *pThis;
  Vec_Int_t *vMap;
  Abc_Nam_t *p2_local;
  Abc_Nam_t *p1_local;
  
  if (p1 == p2) {
    iVar1 = Abc_NamObjNumMax(p1);
    p1_local = (Abc_Nam_t *)Vec_IntStartNatural(iVar1);
  }
  else {
    iVar1 = Abc_NamObjNumMax(p1);
    p1_local = (Abc_Nam_t *)Vec_IntStart(iVar1);
    for (local_40 = 1; iVar1 = Vec_IntSize(&p1->vInt2Handle), local_40 < iVar1;
        local_40 = local_40 + 1) {
      iVar1 = Vec_IntEntry(&p1->vInt2Handle,local_40);
      pStr = Abc_NamHandleToStr(p1,iVar1);
      piVar2 = Abc_NamStrHashFind(p2,pStr,(char *)0x0);
      Vec_IntWriteEntry((Vec_Int_t *)p1_local,local_40,*piVar2);
    }
  }
  return (Vec_Int_t *)p1_local;
}

Assistant:

Vec_Int_t * Abc_NamComputeIdMap( Abc_Nam_t * p1, Abc_Nam_t * p2 )
{
    Vec_Int_t * vMap;
    char * pThis;
    int * piPlace, iHandle1, i;
    if ( p1 == p2 )
        return Vec_IntStartNatural( Abc_NamObjNumMax(p1) );
    vMap = Vec_IntStart( Abc_NamObjNumMax(p1) );
    Vec_IntForEachEntryStart( &p1->vInt2Handle, iHandle1, i, 1 )
    {
        pThis = Abc_NamHandleToStr( p1, iHandle1 );
        piPlace = Abc_NamStrHashFind( p2, pThis, NULL );
        Vec_IntWriteEntry( vMap, i, *piPlace );
//        Abc_Print( 1, "%d->%d  ", i, *piPlace );
    }
    return vMap;
}